

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void free_esni_secret(ptls_esni_secret_t **esni,int is_server)

{
  ptls_esni_secret_t *ppVar1;
  uint8_t *puVar2;
  
  ppVar1 = *esni;
  if (ppVar1 != (ptls_esni_secret_t *)0x0) {
    puVar2 = (ppVar1->secret).base;
    if (puVar2 != (uint8_t *)0x0) {
      (*ptls_clear_memory)(puVar2,(ppVar1->secret).len);
      free(((*esni)->secret).base);
    }
    if (is_server == 0) {
      free(((*esni)->client).pubkey.base);
    }
    (*ptls_clear_memory)(*esni,0xd0);
    free(*esni);
    *esni = (ptls_esni_secret_t *)0x0;
    return;
  }
  __assert_fail("*esni != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                ,0x709,"void free_esni_secret(ptls_esni_secret_t **, int)");
}

Assistant:

static void free_esni_secret(ptls_esni_secret_t **esni, int is_server)
{
    assert(*esni != NULL);
    if ((*esni)->secret.base != NULL) {
        ptls_clear_memory((*esni)->secret.base, (*esni)->secret.len);
        free((*esni)->secret.base);
    }
    if (!is_server)
        free((*esni)->client.pubkey.base);
    ptls_clear_memory((*esni), sizeof(**esni));
    free(*esni);
    *esni = NULL;
}